

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O0

string * __thiscall
flatbuffers::(anonymous_namespace)::LuaBfbsGenerator::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Field *field)

{
  bool bVar1;
  Type *this_00;
  char *__s;
  int64_t iVar2;
  double t;
  allocator<char> local_35 [16];
  allocator<char> local_25;
  BaseType local_24;
  Field *pFStack_20;
  BaseType base_type;
  Field *field_local;
  LuaBfbsGenerator *this_local;
  
  pFStack_20 = field;
  field_local = (Field *)this;
  this_local = (LuaBfbsGenerator *)__return_storage_ptr__;
  this_00 = reflection::Field::type(field);
  local_24 = reflection::Type::base_type(this_00);
  bVar1 = anon_unknown_25::IsFloatingPoint(local_24);
  if (bVar1) {
    t = reflection::Field::default_real(pFStack_20);
    NumToString<double>(__return_storage_ptr__,t);
  }
  else {
    bVar1 = anon_unknown_25::IsBool(local_24);
    if (bVar1) {
      iVar2 = reflection::Field::default_integer(pFStack_20);
      __s = "false";
      if (iVar2 != 0) {
        __s = "true";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_25);
      std::allocator<char>::~allocator(&local_25);
    }
    else {
      bVar1 = IsScalar(local_24);
      if (bVar1) {
        iVar2 = reflection::Field::default_integer(pFStack_20);
        NumToString<long>(__return_storage_ptr__,iVar2);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"0",local_35);
        std::allocator<char>::~allocator(local_35);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const r::Field *field) const {
    const r::BaseType base_type = field->type()->base_type();
    if (IsFloatingPoint(base_type)) {
      return NumToString(field->default_real());
    }
    if (IsBool(base_type)) {
      return field->default_integer() ? "true" : "false";
    }
    if (IsScalar(base_type)) { return NumToString((field->default_integer())); }
    // represents offsets
    return "0";
  }